

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O0

void __thiscall EDColor::ComputeGradientMapByDiZenzo(EDColor *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int local_64;
  int i_1;
  double scale;
  int grad;
  double theta;
  int gxy;
  int gyy;
  int gxx;
  int gyCh3;
  int gxCh3;
  int gyCh2;
  int gxCh2;
  int gyCh1;
  int gxCh1;
  int com2;
  int com1;
  int j;
  int i;
  int max;
  EDColor *this_local;
  
  memset(this->gradImg,0,(long)this->width * 2 * (long)this->height);
  j = 0;
  for (com1 = 1; com1 < this->height + -1; com1 = com1 + 1) {
    for (com2 = 1; com2 < this->width + -1; com2 = com2 + 1) {
      iVar1 = (uint)this->smooth_L[(com1 + 1) * this->width + com2 + 1] -
              (uint)this->smooth_L[(com1 + -1) * this->width + com2 + -1];
      iVar2 = (uint)this->smooth_L[(com1 + -1) * this->width + com2 + 1] -
              (uint)this->smooth_L[(com1 + 1) * this->width + com2 + -1];
      iVar3 = iVar1 + iVar2 +
              ((uint)this->smooth_L[com1 * this->width + com2 + 1] -
              (uint)this->smooth_L[com1 * this->width + com2 + -1]);
      iVar1 = (iVar1 - iVar2) +
              ((uint)this->smooth_L[(com1 + 1) * this->width + com2] -
              (uint)this->smooth_L[(com1 + -1) * this->width + com2]);
      iVar2 = (uint)this->smooth_a[(com1 + 1) * this->width + com2 + 1] -
              (uint)this->smooth_a[(com1 + -1) * this->width + com2 + -1];
      iVar4 = (uint)this->smooth_a[(com1 + -1) * this->width + com2 + 1] -
              (uint)this->smooth_a[(com1 + 1) * this->width + com2 + -1];
      iVar5 = iVar2 + iVar4 +
              ((uint)this->smooth_a[com1 * this->width + com2 + 1] -
              (uint)this->smooth_a[com1 * this->width + com2 + -1]);
      iVar2 = (iVar2 - iVar4) +
              ((uint)this->smooth_a[(com1 + 1) * this->width + com2] -
              (uint)this->smooth_a[(com1 + -1) * this->width + com2]);
      iVar4 = (uint)this->smooth_b[(com1 + 1) * this->width + com2 + 1] -
              (uint)this->smooth_b[(com1 + -1) * this->width + com2 + -1];
      iVar6 = (uint)this->smooth_b[(com1 + -1) * this->width + com2 + 1] -
              (uint)this->smooth_b[(com1 + 1) * this->width + com2 + -1];
      iVar7 = iVar4 + iVar6 +
              ((uint)this->smooth_b[com1 * this->width + com2 + 1] -
              (uint)this->smooth_b[com1 * this->width + com2 + -1]);
      iVar4 = (iVar4 - iVar6) +
              ((uint)this->smooth_b[(com1 + 1) * this->width + com2] -
              (uint)this->smooth_b[(com1 + -1) * this->width + com2]);
      iVar6 = iVar3 * iVar3 + iVar5 * iVar5 + iVar7 * iVar7;
      iVar8 = iVar1 * iVar1 + iVar2 * iVar2 + iVar4 * iVar4;
      iVar1 = iVar3 * iVar1 + iVar5 * iVar2 + iVar7 * iVar4;
      dVar9 = atan2((double)iVar1 * 2.0,(double)(iVar6 - iVar8));
      dVar9 = dVar9 / 2.0;
      dVar10 = cos(dVar9 * 2.0);
      dVar11 = sin(dVar9 * 2.0);
      dVar10 = sqrt(((double)(iVar1 * 2) * dVar11 +
                    (double)(iVar6 - iVar8) * dVar10 + (double)(iVar6 + iVar8)) / 2.0);
      iVar1 = (int)(dVar10 + 0.5);
      if ((dVar9 < -0.7853975) || (0.7853975 < dVar9)) {
        this->dirImg[com1 * this->width + com2] = '\x02';
      }
      else {
        this->dirImg[com1 * this->width + com2] = '\x01';
      }
      this->gradImg[com1 * this->width + com2] = (short)iVar1;
      if (j < iVar1) {
        j = iVar1;
      }
    }
  }
  for (local_64 = 0; local_64 < this->width * this->height; local_64 = local_64 + 1) {
    this->gradImg[local_64] =
         (short)(int)((double)(int)this->gradImg[local_64] * (255.0 / (double)j));
  }
  return;
}

Assistant:

void EDColor::ComputeGradientMapByDiZenzo()
{
	memset(gradImg, 0, sizeof(short)*width*height);

	int max = 0;

	for (int i = 1; i < height - 1; i++) {
		for (int j = 1; j < width - 1; j++) {
#if 1
			// Prewitt for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = com1 + com2 + (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]);
			int gyCh1 = com1 - com2 + (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]);

			// Prewitt for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = com1 + com2 + (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]);
			int gyCh2 = com1 - com2 + (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]);

			// Prewitt for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = com1 + com2 + (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]);
			int gyCh3 = com1 - com2 + (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]);
#else
			// Sobel for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = com1 + com2 + 2 * (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]);
			int gyCh1 = com1 - com2 + 2 * (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]);

			// Sobel for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = com1 + com2 + 2 * (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]);
			int gyCh2 = com1 - com2 + 2 * (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]);

			// Sobel for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = com1 + com2 + 2 * (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]);
			int gyCh3 = com1 - com2 + 2 * (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]);
#endif
			int gxx = gxCh1*gxCh1 + gxCh2*gxCh2 + gxCh3*gxCh3;
			int gyy = gyCh1*gyCh1 + gyCh2*gyCh2 + gyCh3*gyCh3;
			int gxy = gxCh1*gyCh1 + gxCh2*gyCh2 + gxCh3*gyCh3;

#if 1
			// Di Zenzo's formulas from Gonzales & Woods - Page 337
			double theta = atan2(2.0*gxy, (double)(gxx - gyy)) / 2; // Gradient Direction
			int grad = (int)(sqrt(((gxx + gyy) + (gxx - gyy)*cos(2 * theta) + 2 * gxy*sin(2 * theta)) / 2.0) + 0.5); // Gradient Magnitude
#else
			// Koschan & Abidi - 2005 - Signal Processing Magazine
			double theta = atan2(2.0*gxy, (double)(gxx - gyy)) / 2; // Gradient Direction

			double cosTheta = cos(theta);
			double sinTheta = sin(theta);
			int grad = (int)(sqrt(gxx*cosTheta*cosTheta + 2 * gxy*sinTheta*cosTheta + gyy*sinTheta*sinTheta) + 0.5); // Gradient Magnitude
#endif

			// Gradient is perpendicular to the edge passing through the pixel	
			if (theta >= -3.14159 / 4 && theta <= 3.14159 / 4)
				dirImg[i*width + j] = EDGE_VERTICAL;
			else
				dirImg[i*width + j] = EDGE_HORIZONTAL;

			gradImg[i*width + j] = grad;
			if (grad > max) max = grad;

		}
	} // end outer for

	// Scale the gradient values to 0-255
	double scale = 255.0 / max;
	for (int i = 0; i<width*height; i++)
		gradImg[i] = (short)(gradImg[i] * scale);
}